

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool __thiscall libwebm::Webm2Pes::InitWebmParser(Webm2Pes *this)

{
  __type _Var1;
  int iVar2;
  Codec CVar3;
  longlong lVar4;
  long lVar5;
  Tracks *this_00;
  SegmentInfo *this_01;
  unsigned_long uVar6;
  Track *this_02;
  char *pcVar7;
  pointer pcVar8;
  char *pcVar9;
  unsigned_long idx;
  allocator local_71;
  Segment *webm_parser;
  string codec_id;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  iVar2 = mkvparser::MkvReader::Open(&this->webm_reader_,(this->input_file_name_)._M_dataplus._M_p);
  if (iVar2 == 0) {
    webm_parser = (Segment *)0x0;
    lVar4 = mkvparser::Segment::CreateInstance
                      (&(this->webm_reader_).super_IMkvReader,0,&webm_parser,kTypeSeekable);
    if (lVar4 != 0) {
      fwrite("Webm2Pes: Cannot create WebM parser.\n",0x25,1,_stderr);
      return false;
    }
    std::__uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>::reset
              ((__uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_> *)
               &this->webm_parser_,webm_parser);
    lVar5 = mkvparser::Segment::Load
                      ((this->webm_parser_)._M_t.
                       super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                       .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
    if (lVar5 == 0) {
      this_00 = mkvparser::Segment::GetTracks
                          ((this->webm_parser_)._M_t.
                           super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                           .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
      if (this_00 == (Tracks *)0x0) {
        pcVar8 = (this->input_file_name_)._M_dataplus._M_p;
        pcVar9 = "Webm2Pes: %s has no tracks.\n";
      }
      else {
        this_01 = mkvparser::Segment::GetInfo
                            ((this->webm_parser_)._M_t.
                             super___uniq_ptr_impl<mkvparser::Segment,_std::default_delete<mkvparser::Segment>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_mkvparser::Segment_*,_std::default_delete<mkvparser::Segment>_>
                             .super__Head_base<0UL,_mkvparser::Segment_*,_false>._M_head_impl);
        lVar4 = mkvparser::SegmentInfo::GetTimeCodeScale(this_01);
        this->timecode_scale_ = lVar4;
        for (idx = 0; uVar6 = mkvparser::Tracks::GetTracksCount(this_00),
            (long)idx < (long)(int)uVar6; idx = idx + 1) {
          this_02 = mkvparser::Tracks::GetTrackByIndex(this_00,idx);
          if ((this_02 != (Track *)0x0) && (lVar5 = mkvparser::Track::GetType(this_02), lVar5 == 1))
          {
            pcVar7 = mkvparser::Track::GetCodecId(this_02);
            pcVar9 = "";
            if (pcVar7 != (char *)0x0) {
              pcVar9 = pcVar7;
            }
            std::__cxx11::string::string((string *)&codec_id,pcVar9,(allocator *)&local_48);
            std::__cxx11::string::string((string *)&local_48,"V_VP8",&local_71);
            _Var1 = std::operator==(&codec_id,&local_48);
            std::__cxx11::string::~string((string *)&local_48);
            CVar3 = kVP8;
            if (!_Var1) {
              std::__cxx11::string::string((string *)&local_48,"V_VP9",&local_71);
              _Var1 = std::operator==(&codec_id,&local_48);
              std::__cxx11::string::~string((string *)&local_48);
              if (!_Var1) {
                fwrite("Webm2Pes: Codec must be VP8 or VP9.\n",0x24,1,_stderr);
                std::__cxx11::string::~string((string *)&codec_id);
                return false;
              }
              CVar3 = kVP9;
            }
            this->codec_ = CVar3;
            this->video_track_num_ = (int)idx + 1;
            std::__cxx11::string::~string((string *)&codec_id);
            break;
          }
        }
        if (0 < this->video_track_num_) {
          return true;
        }
        pcVar8 = (this->input_file_name_)._M_dataplus._M_p;
        pcVar9 = "Webm2Pes: No video track found in %s.\n";
      }
    }
    else {
      pcVar8 = (this->input_file_name_)._M_dataplus._M_p;
      pcVar9 = "Webm2Pes: Cannot parse %s.\n";
    }
  }
  else {
    pcVar8 = (this->input_file_name_)._M_dataplus._M_p;
    pcVar9 = "Webm2Pes: Cannot open %s as input.\n";
  }
  fprintf(_stderr,pcVar9,pcVar8);
  return false;
}

Assistant:

bool Webm2Pes::InitWebmParser() {
  if (webm_reader_.Open(input_file_name_.c_str()) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot open %s as input.\n",
                 input_file_name_.c_str());
    return false;
  }

  using mkvparser::Segment;
  Segment* webm_parser = nullptr;
  if (Segment::CreateInstance(&webm_reader_, 0 /* pos */,
                              webm_parser /* Segment*& */) != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot create WebM parser.\n");
    return false;
  }
  webm_parser_.reset(webm_parser);

  if (webm_parser_->Load() != 0) {
    std::fprintf(stderr, "Webm2Pes: Cannot parse %s.\n",
                 input_file_name_.c_str());
    return false;
  }

  // Make sure there's a video track.
  const mkvparser::Tracks* tracks = webm_parser_->GetTracks();
  if (tracks == nullptr) {
    std::fprintf(stderr, "Webm2Pes: %s has no tracks.\n",
                 input_file_name_.c_str());
    return false;
  }

  timecode_scale_ = webm_parser_->GetInfo()->GetTimeCodeScale();

  for (int track_index = 0;
       track_index < static_cast<int>(tracks->GetTracksCount());
       ++track_index) {
    const mkvparser::Track* track = tracks->GetTrackByIndex(track_index);
    if (track && track->GetType() == mkvparser::Track::kVideo) {
      const std::string codec_id = ToString(track->GetCodecId());
      if (codec_id == std::string("V_VP8")) {
        codec_ = VideoFrame::kVP8;
      } else if (codec_id == std::string("V_VP9")) {
        codec_ = VideoFrame::kVP9;
      } else {
        fprintf(stderr, "Webm2Pes: Codec must be VP8 or VP9.\n");
        return false;
      }
      video_track_num_ = track_index + 1;
      break;
    }
  }
  if (video_track_num_ < 1) {
    std::fprintf(stderr, "Webm2Pes: No video track found in %s.\n",
                 input_file_name_.c_str());
    return false;
  }
  return true;
}